

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O1

void __thiscall
discordpp::Embed::Embed
          (Embed *this,
          omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *title,omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *type,
          omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *description,
          omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *url,omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *timestamp,omittable_field<int> *color,
          omittable_field<discordpp::EmbedFooter> *footer,
          omittable_field<discordpp::EmbedImage> *image,
          omittable_field<discordpp::EmbedThumbnail> *thumbnail,
          omittable_field<discordpp::EmbedVideo> *video,
          omittable_field<discordpp::EmbedProvider> *provider,
          omittable_field<discordpp::EmbedAuthor> *author,
          omittable_field<std::vector<discordpp::EmbedField,_std::allocator<discordpp::EmbedField>_>_>
          *fields)

{
  _Head_base<0UL,_int_*,_false> _Var1;
  _Head_base<0UL,_int_*,_false> _Var2;
  pointer *__ptr;
  pointer *__ptr_1;
  pointer *__ptr_2;
  pointer *__ptr_4;
  pointer *__ptr_3;
  
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->title).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&title->
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->title)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e258;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->type).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&type->
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->type)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e258;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->description).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&description->
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->description)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e258;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->url).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&url->
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->url)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e258;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->timestamp).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&timestamp->
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->timestamp)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e258;
  _Var1._M_head_impl =
       (color->super_field<int>).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var1._M_head_impl == (int *)0x0) {
    (this->color).super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
    _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl = (int *)0x0;
    _Var2._M_head_impl = (int *)0x0;
  }
  else {
    _Var2._M_head_impl = (int *)operator_new(4);
    *_Var2._M_head_impl = *_Var1._M_head_impl;
  }
  (this->color).super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var2._M_head_impl;
  (this->color).super_field<int>.s_ = (color->super_field<int>).s_;
  (this->color)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e298;
  field<discordpp::EmbedFooter>::field
            (&(this->footer).super_field<discordpp::EmbedFooter>,
             &footer->super_field<discordpp::EmbedFooter>);
  (this->footer)._vptr_omittable_field = (_func_int **)&PTR_operator__0024f548;
  field<discordpp::EmbedImage>::field
            (&(this->image).super_field<discordpp::EmbedImage>,
             &image->super_field<discordpp::EmbedImage>);
  (this->image)._vptr_omittable_field = (_func_int **)&PTR_operator__0024f598;
  field<discordpp::EmbedThumbnail>::field
            (&(this->thumbnail).super_field<discordpp::EmbedThumbnail>,
             &thumbnail->super_field<discordpp::EmbedThumbnail>);
  (this->thumbnail)._vptr_omittable_field = (_func_int **)&PTR_operator__0024f5e8;
  field<discordpp::EmbedVideo>::field
            (&(this->video).super_field<discordpp::EmbedVideo>,
             &video->super_field<discordpp::EmbedVideo>);
  (this->video)._vptr_omittable_field = (_func_int **)&PTR_operator__0024f638;
  field<discordpp::EmbedProvider>::field
            (&(this->provider).super_field<discordpp::EmbedProvider>,
             &provider->super_field<discordpp::EmbedProvider>);
  (this->provider)._vptr_omittable_field = (_func_int **)&PTR_operator__0024f688;
  field<discordpp::EmbedAuthor>::field
            (&(this->author).super_field<discordpp::EmbedAuthor>,
             &author->super_field<discordpp::EmbedAuthor>);
  (this->author)._vptr_omittable_field = (_func_int **)&PTR_operator__0024f6d8;
  field<std::vector<discordpp::EmbedField,_std::allocator<discordpp::EmbedField>_>_>::field
            (&(this->fields).
              super_field<std::vector<discordpp::EmbedField,_std::allocator<discordpp::EmbedField>_>_>
             ,&fields->
               super_field<std::vector<discordpp::EmbedField,_std::allocator<discordpp::EmbedField>_>_>
            );
  (this->fields)._vptr_omittable_field = (_func_int **)&PTR_operator__0024f728;
  return;
}

Assistant:

Embed(
        omittable_field<std::string> title = omitted,
        omittable_field<std::string> type = omitted,
        omittable_field<std::string> description = omitted,
        omittable_field<std::string> url = omitted,
        omittable_field<Timestamp> timestamp = omitted,
        omittable_field<int> color = omitted,
        omittable_field<EmbedFooter> footer = omitted,
        omittable_field<EmbedImage> image = omitted,
        omittable_field<EmbedThumbnail> thumbnail = omitted,
        omittable_field<EmbedVideo> video = omitted,
        omittable_field<EmbedProvider> provider = omitted,
        omittable_field<EmbedAuthor> author = omitted,
        omittable_field<std::vector<EmbedField> > fields = omitted
    ):
        title(title),
        type(type),
        description(description),
        url(url),
        timestamp(timestamp),
        color(color),
        footer(footer),
        image(image),
        thumbnail(thumbnail),
        video(video),
        provider(provider),
        author(author),
        fields(fields)
    {}